

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::MarbleTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,MarbleTexture *this)

{
  float *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::TextureMapping3DHandle_const&,int_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ MarbleTexture mapping: %s octaves: %d omega: %f scale: %f variation: %f ]",
             (char *)this,(TextureMapping3DHandle *)&this->octaves,(int *)&this->omega,&this->scale,
             &this->variation,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string MarbleTexture::ToString() const {
    return StringPrintf("[ MarbleTexture mapping: %s octaves: %d omega: %f "
                        "scale: %f variation: %f ]",
                        mapping, octaves, omega, scale, variation);
}